

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

void __thiscall ON_ClippingPlaneDataList::~ON_ClippingPlaneDataList(ON_ClippingPlaneDataList *this)

{
  ON_ClippingPlaneData *pOVar1;
  int iVar2;
  ON_ClippingPlaneData **ppOVar3;
  long lVar4;
  
  iVar2 = (this->m_list).m_count;
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      ppOVar3 = (this->m_list).m_a;
      pOVar1 = ppOVar3[lVar4];
      if (pOVar1 != (ON_ClippingPlaneData *)0x0) {
        ON_SimpleArray<int>::~ON_SimpleArray(&pOVar1->m_layer_list);
        ON_UuidList::~ON_UuidList(&pOVar1->m_object_id_list);
        operator_delete(pOVar1,0x50);
        ppOVar3 = (this->m_list).m_a;
        iVar2 = (this->m_list).m_count;
      }
      ppOVar3[lVar4] = (ON_ClippingPlaneData *)0x0;
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  ON_SimpleArray<ON_ClippingPlaneData_*>::~ON_SimpleArray(&this->m_list);
  return;
}

Assistant:

ON_ClippingPlaneDataList::~ON_ClippingPlaneDataList()
{
  for(int i=0; i<m_list.Count(); i++)
  {
    ON_ClippingPlaneData* data = m_list[i];
    if (data)
      delete data;
    m_list[i] = nullptr;
  }
}